

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall cmComputeLinkInformation::AddFullItem(cmComputeLinkInformation *this,string *item)

{
  bool bVar1;
  PolicyStatus PVar2;
  long lVar3;
  iterator iVar4;
  LinkType lt;
  string file;
  string generator;
  
  bVar1 = CheckImplicitDirItem(this,item);
  if (bVar1) {
    return;
  }
  if ((this->NoSONameUsesPath == true) && (bVar1 = CheckSharedLibNoSOName(this,item), bVar1)) {
    return;
  }
  (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(&generator);
  PVar2 = cmGeneratorTarget::GetPolicyStatusCMP0008(this->Target);
  if ((PVar2 != NEW) &&
     ((lVar3 = std::__cxx11::string::find((char *)&generator,0x558051), lVar3 != -1 ||
      (lVar3 = std::__cxx11::string::find((char *)&generator,0x55805f), lVar3 != -1)))) {
    cmsys::SystemTools::GetFilenameName(&file,item);
    bVar1 = cmsys::RegularExpression::find(&this->ExtractAnyLibraryName,file._M_dataplus._M_p);
    if (!bVar1) {
      HandleBadFullItem(this,item,&file);
      goto LAB_003ed0f8;
    }
    std::__cxx11::string::~string((string *)&file);
  }
  if (this->LinkTypeEnabled == true) {
    cmsys::SystemTools::GetFilenameName(&file,item);
    bVar1 = cmsys::RegularExpression::find(&this->ExtractSharedLibraryName,file._M_dataplus._M_p);
    if (bVar1) {
      lt = LinkShared;
LAB_003ed039:
      SetCurrentLinkType(this,lt);
    }
    else {
      bVar1 = cmsys::RegularExpression::find(&this->ExtractStaticLibraryName,item);
      if (!bVar1) {
        lt = this->StartLinkType;
        goto LAB_003ed039;
      }
    }
    std::__cxx11::string::~string((string *)&file);
  }
  if (this->OldLinkDirMode == true) {
    cmsys::SystemTools::GetFilenamePath(&file,item);
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(this->OldLinkDirMask)._M_t,&file);
    std::__cxx11::string::~string((string *)&file);
    if ((_Rb_tree_header *)iVar4._M_node ==
        &(this->OldLinkDirMask)._M_t._M_impl.super__Rb_tree_header) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->OldLinkDirItems,item);
    }
  }
  if ((this->LibLinkFileFlag)._M_string_length != 0) {
    std::__cxx11::string::string((string *)&file,(string *)&this->LibLinkFileFlag);
    std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
    emplace_back<cmComputeLinkInformation::Item>(&this->Items,(Item *)&file);
    std::__cxx11::string::~string((string *)&file);
  }
  std::__cxx11::string::string((string *)&file,(string *)item);
  std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
  emplace_back<cmComputeLinkInformation::Item>(&this->Items,(Item *)&file);
LAB_003ed0f8:
  std::__cxx11::string::~string((string *)&file);
  std::__cxx11::string::~string((string *)&generator);
  return;
}

Assistant:

void cmComputeLinkInformation::AddFullItem(std::string const& item)
{
  // Check for the implicit link directory special case.
  if(this->CheckImplicitDirItem(item))
    {
    return;
    }

  // Check for case of shared library with no builtin soname.
  if(this->NoSONameUsesPath && this->CheckSharedLibNoSOName(item))
    {
    return;
    }

  // Full path libraries should specify a valid library file name.
  // See documentation of CMP0008.
  std::string generator = this->GlobalGenerator->GetName();
  if(this->Target->GetPolicyStatusCMP0008() != cmPolicies::NEW &&
     (generator.find("Visual Studio") != generator.npos ||
      generator.find("Xcode") != generator.npos))
    {
    std::string file = cmSystemTools::GetFilenameName(item);
    if(!this->ExtractAnyLibraryName.find(file.c_str()))
      {
      this->HandleBadFullItem(item, file);
      return;
      }
    }

  // This is called to handle a link item that is a full path.
  // If the target is not a static library make sure the link type is
  // shared.  This is because dynamic-mode linking can handle both
  // shared and static libraries but static-mode can handle only
  // static libraries.  If a previous user item changed the link type
  // to static we need to make sure it is back to shared.
  if(this->LinkTypeEnabled)
    {
    std::string name = cmSystemTools::GetFilenameName(item);
    if(this->ExtractSharedLibraryName.find(name))
      {
      this->SetCurrentLinkType(LinkShared);
      }
    else if(!this->ExtractStaticLibraryName.find(item))
      {
      // We cannot determine the type.  Assume it is the target's
      // default type.
      this->SetCurrentLinkType(this->StartLinkType);
      }
    }

  // For compatibility with CMake 2.4 include the item's directory in
  // the linker search path.
  if(this->OldLinkDirMode &&
     this->OldLinkDirMask.find(cmSystemTools::GetFilenamePath(item)) ==
     this->OldLinkDirMask.end())
    {
    this->OldLinkDirItems.push_back(item);
    }

  // If this platform wants a flag before the full path, add it.
  if(!this->LibLinkFileFlag.empty())
    {
    this->Items.push_back(Item(this->LibLinkFileFlag, false));
    }

  // Now add the full path to the library.
  this->Items.push_back(Item(item, true));
}